

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::disp_data_source_t::set_data_sources_name_base(disp_data_source_t *this,string *name_base)

{
  pointer pcVar1;
  string local_68;
  prefix_t local_48;
  
  pcVar1 = (name_base->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + name_base->_M_string_length);
  reuse::make_disp_prefix(&local_48,"pdt-opp",&local_68,this->m_dispatcher);
  *(undefined8 *)((this->m_base_prefix).m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x18) = local_48.m_value._24_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x20) = local_48.m_value._32_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x28) = local_48.m_value._40_8_;
  *(undefined8 *)(this->m_base_prefix).m_value = local_48.m_value._0_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 8) = local_48.m_value._8_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x18) = local_48.m_value._24_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
				set_data_sources_name_base(
					const std::string & name_base )
					{
						using namespace so_5::disp::reuse;

						m_base_prefix = make_disp_prefix(
								"pdt-opp",
								name_base,
								&m_dispatcher );
					}